

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_data.hpp
# Opt level: O2

void __thiscall duckdb::ProgressData::Normalize(ProgressData *this,double target)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = IsValid(this);
  if (bVar1) {
    uVar2 = -(ulong)(0.0 < this->total);
    this->done = (double)(~uVar2 & (ulong)this->done | (ulong)(this->done / this->total) & uVar2) *
                 target;
    this->total = target;
  }
  else {
    this->invalid = true;
    this->done = 0.0;
    this->total = 1.0;
  }
  return;
}

Assistant:

void Normalize(const double target = 1.0) {
		// Normalize checks only `target`, propagating invalid
		D_ASSERT(target > 0.0);
		if (IsValid()) {
			if (total > 0.0) {
				done /= total;
			}
			total = 1.0;
			done *= target;
			total *= target;
		} else {
			SetInvalid();
		}
	}